

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__resample_horizontal_downsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  stbir__contributors *psVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  
  if (1.0 < stbir_info->horizontal_scale) {
    __assert_fail("!stbir__use_width_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x601,"void stbir__resample_horizontal_downsample(stbir__info *, float *)");
  }
  uVar2 = stbir_info->channels;
  lVar13 = (long)(int)uVar2;
  pfVar15 = stbir_info->decode_buffer;
  iVar3 = stbir_info->horizontal_filter_pixel_margin;
  lVar16 = (long)iVar3;
  lVar7 = (long)(int)(iVar3 * uVar2);
  psVar5 = stbir_info->horizontal_contributors;
  pfVar6 = stbir_info->horizontal_coefficients;
  iVar4 = stbir_info->horizontal_coefficient_width;
  uVar10 = iVar3 * 2 + stbir_info->input_w;
  switch(uVar2) {
  case 1:
    uVar9 = 0;
    uVar8 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar8 = uVar9;
    }
    for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
      iVar3 = psVar5[uVar14].n1;
      iVar12 = (int)uVar9;
      for (lVar13 = (long)psVar5[uVar14].n0; lVar13 <= iVar3; lVar13 = lVar13 + 1) {
        fVar1 = pfVar6[(int)uVar9];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x613,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        output_buffer[lVar13] = fVar1 * pfVar15[lVar7 + (uVar14 - lVar16)] + output_buffer[lVar13];
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      uVar9 = (ulong)(uint)(iVar12 + iVar4);
    }
    break;
  case 2:
    uVar9 = 0;
    uVar8 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar8 = uVar9;
    }
    for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
      iVar3 = psVar5[uVar14].n1;
      iVar12 = (int)uVar9;
      for (lVar13 = (long)psVar5[uVar14].n0; lVar13 <= iVar3; lVar13 = lVar13 + 1) {
        fVar1 = pfVar6[(int)uVar9];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x628,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        output_buffer[lVar13 * 2] =
             pfVar15[lVar7 + (uVar14 - lVar16) * 2] * fVar1 + output_buffer[lVar13 * 2];
        output_buffer[lVar13 * 2 + 1] =
             fVar1 * pfVar15[lVar7 + (uVar14 - lVar16) * 2 + 1] + output_buffer[lVar13 * 2 + 1];
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      uVar9 = (ulong)(uint)(iVar12 + iVar4);
    }
    break;
  case 3:
    uVar9 = 0;
    uVar8 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar8 = uVar9;
    }
    for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
      lVar13 = (long)psVar5[uVar14].n0;
      iVar3 = psVar5[uVar14].n1;
      lVar11 = uVar14 - lVar16;
      pfVar18 = output_buffer + lVar13 * 3 + 2;
      iVar12 = (int)uVar9;
      for (; lVar13 <= iVar3; lVar13 = lVar13 + 1) {
        fVar1 = pfVar6[(int)uVar9];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x63e,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        pfVar18[-2] = pfVar15[lVar7 + lVar11 * 3] * fVar1 + pfVar18[-2];
        pfVar18[-1] = pfVar15[lVar7 + lVar11 * 3 + 1] * fVar1 + pfVar18[-1];
        *pfVar18 = fVar1 * pfVar15[lVar7 + lVar11 * 3 + 2] + *pfVar18;
        pfVar18 = pfVar18 + 3;
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      uVar9 = (ulong)(uint)(iVar12 + iVar4);
    }
    break;
  case 4:
    uVar9 = 0;
    uVar8 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar8 = uVar9;
    }
    for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
      lVar13 = (long)psVar5[uVar14].n0;
      iVar3 = psVar5[uVar14].n1;
      lVar11 = uVar14 - lVar16;
      pfVar18 = output_buffer + lVar13 * 4 + 3;
      iVar12 = (int)uVar9;
      for (; lVar13 <= iVar3; lVar13 = lVar13 + 1) {
        fVar1 = pfVar6[(int)uVar9];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x655,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        pfVar18[-3] = pfVar15[lVar7 + lVar11 * 4] * fVar1 + pfVar18[-3];
        pfVar18[-2] = pfVar15[lVar7 + lVar11 * 4 + 1] * fVar1 + pfVar18[-2];
        pfVar18[-1] = pfVar15[lVar7 + lVar11 * 4 + 2] * fVar1 + pfVar18[-1];
        *pfVar18 = fVar1 * pfVar15[lVar7 + lVar11 * 4 + 3] + *pfVar18;
        uVar9 = (ulong)((int)uVar9 + 1);
        pfVar18 = pfVar18 + 4;
      }
      uVar9 = (ulong)(uint)(iVar12 + iVar4);
    }
    break;
  default:
    uVar9 = 0;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    uVar14 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar14 = uVar9;
    }
    pfVar15 = pfVar15 + (lVar7 - lVar16 * lVar13);
    for (; uVar9 != uVar14; uVar9 = uVar9 + 1) {
      iVar3 = psVar5[uVar9].n0;
      lVar7 = (long)iVar3;
      iVar12 = psVar5[uVar9].n1;
      pfVar18 = (float *)(lVar13 * 4 * lVar7 + (long)output_buffer);
      for (; lVar7 <= iVar12; lVar7 = lVar7 + 1) {
        fVar1 = pfVar6[(iVar4 * (int)uVar9 - iVar3) + (int)lVar7];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x66e,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
          pfVar18[uVar17] = pfVar15[uVar17] * fVar1 + pfVar18[uVar17];
        }
        pfVar18 = pfVar18 + lVar13;
      }
      pfVar15 = pfVar15 + lVar13;
    }
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_downsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int input_w = stbir_info->input_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;
    int filter_pixel_margin = stbir_info->horizontal_filter_pixel_margin;
    int max_x = input_w + filter_pixel_margin * 2;

    STBIR_ASSERT(!stbir__use_width_upsampling(stbir_info));

    switch (channels) {
        case 1:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 1;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
            }
            break;

        case 2:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 2;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
            }
            break;

        case 3:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 3;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
            }
            break;

        case 4:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 4;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
            }
            break;

        default:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * channels;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int c;
                    int out_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
            }
            break;
    }
}